

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Open(PersistentStorageJson *this)

{
  value_t vVar1;
  json_value jVar2;
  Status SVar3;
  undefined1 local_30 [8];
  json_value local_28;
  
  if ((this->mFileName)._M_string_length == 0) {
    JsonDefault_abi_cxx11_((PersistentStorageJson *)local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    vVar1 = (this->mCache).m_type;
    (this->mCache).m_type = local_30[0];
    jVar2 = (this->mCache).m_value;
    (this->mCache).m_value = local_28;
    local_30[0] = vVar1;
    local_28 = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(&this->mCache);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_28.boolean,local_30[0]);
  }
  CacheFromFile(this);
  SVar3 = CacheToFile(this);
  return SVar3;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Open()
{
    if (mFileName.empty())
    {
        // No persistence, use default contents
        mCache = JsonDefault();
    }
    CacheFromFile();
    return CacheToFile();
}